

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann::KalbachMann
          (KalbachMann *this,double energy,long nd,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *data)

{
  pointer paVar1;
  pointer paVar2;
  pointer local_98;
  pointer pdStack_90;
  pointer local_88;
  double local_80;
  ListRecord local_78;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *local_28;
  
  paVar1 = (data->
           super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (data->
           super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_80 = energy;
  local_28 = data;
  ranges::detail::to_container::fn<meta::id<std::vector<double,std::allocator<double>>>>::
  impl<std::vector<double,std::allocator<double>>,ranges::basic_iterator<ranges::join_view<ranges::ref_view<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>>::cursor<true>>,ranges::join_view<ranges::ref_view<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>>>
            (&local_98);
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)((long)paVar2 - (long)paVar1 >> 5);
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)pdStack_90 - (long)local_98 >> 3;
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 2;
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = local_80;
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_98;
  local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdStack_90;
  local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_88;
  local_98 = (pointer)0x0;
  pdStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       nd;
  KalbachMann(this,&local_78);
  if (local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

KalbachMann( double energy, long nd,
             std::vector< std::array< double, 4 > >&& data )
  try : KalbachMann( ListRecord( 0.0, energy, nd, 2, data.size(),
                                 generateList( std::move( data ) ) ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing Kalbach-Mann distribution "
               "data (LAW=1 LANG=2)" );
    throw;
  }